

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply_test.cc
# Opt level: O2

void intgemm::kernel_multiply_test<(intgemm::CPUType)3,signed_char>(void)

{
  undefined1 auVar1 [32];
  size_t sVar2;
  ulong uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  char local_101;
  AlignedVector<signed_char> input2;
  AlignedVector<signed_char> input1;
  AlignedVector<signed_char> output;
  SourceLineInfo local_c8;
  StringRef local_b8;
  BinaryExpr<const_signed_char_&,_const_signed_char_&> local_a8;
  AssertionHandler catchAssertionHandler;
  
  if (2 < kCPU) {
    AlignedVector<signed_char>::AlignedVector(&input1,0x20,0x40);
    AlignedVector<signed_char>::AlignedVector(&input2,0x20,0x40);
    AlignedVector<signed_char>::AlignedVector(&output,0x20,0x40);
    for (sVar2 = 0; input1.size_ != sVar2; sVar2 = sVar2 + 1) {
      input1.mem_[sVar2] = (char)sVar2 + -0x10;
    }
    for (sVar2 = 0; input2.size_ != sVar2; sVar2 = sVar2 + 1) {
      input2.mem_[sVar2] = (char)sVar2 + -10;
    }
    auVar1 = vpmullw_avx2(*(undefined1 (*) [32])input2.mem_,*(undefined1 (*) [32])input1.mem_);
    auVar4 = vpsrlw_avx2(*(undefined1 (*) [32])input1.mem_,8);
    auVar5 = vpsrlw_avx2(*(undefined1 (*) [32])input2.mem_,8);
    auVar4 = vpmullw_avx2(auVar5,auVar4);
    auVar4 = vpsllw_avx2(auVar4,8);
    auVar1 = vpand_avx2(auVar1,_DAT_00195600);
    auVar1 = vpor_avx2(auVar1,auVar4);
    *(undefined1 (*) [32])output.mem_ = auVar1;
    for (uVar3 = 0; uVar3 < output.size_; uVar3 = uVar3 + 1) {
      local_a8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x18fab9;
      local_a8.super_ITransientExpression.m_isBinaryExpression = true;
      local_a8.super_ITransientExpression.m_result = false;
      local_a8.super_ITransientExpression._10_6_ = 0;
      local_c8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/multiply_test.cc"
      ;
      local_c8.line = 0x1b;
      Catch::StringRef::StringRef(&local_b8,"output[i] == Type_(input1[i] * input2[i])");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_a8,&local_c8,local_b8,ContinueOnFailure)
      ;
      local_c8.file = output.mem_ + uVar3;
      local_101 = input2.mem_[uVar3] * input1.mem_[uVar3];
      Catch::ExprLhs<signed_char_const&>::operator==
                (&local_a8,(ExprLhs<signed_char_const&> *)&local_c8,&local_101);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,&local_a8.super_ITransientExpression);
      Catch::ITransientExpression::~ITransientExpression(&local_a8.super_ITransientExpression);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    free(output.mem_);
    free(input2.mem_);
    free(input1.mem_);
  }
  return;
}

Assistant:

void kernel_multiply_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, Type_>;
  constexpr int VECTOR_LENGTH = sizeof(vec_t) / sizeof(Type_);

  AlignedVector<Type_> input1(VECTOR_LENGTH);
  AlignedVector<Type_> input2(VECTOR_LENGTH);
  AlignedVector<Type_> output(VECTOR_LENGTH);

  std::iota(input1.begin(), input1.end(), static_cast<Type_>(-VECTOR_LENGTH / 2));
  std::iota(input2.begin(), input2.end(), static_cast<Type_>(-VECTOR_LENGTH / 3));

  *output.template as<vec_t>() = kernels::multiply<Type_>(*input1.template as<vec_t>(), *input2.template as<vec_t>());
  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == Type_(input1[i] * input2[i]));
}